

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_disks.cpp
# Opt level: O3

int benchmark_disks(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint batch_size;
  external_size_type block_size;
  external_size_type offset;
  external_size_type size;
  string allocstr;
  string optrw;
  CmdlineParser cp;
  string local_2c0;
  uint local_29c;
  uint64_t local_298;
  uint64_t local_290;
  uint64_t local_288;
  string local_280;
  string local_260;
  undefined1 local_240 [376];
  CmdlineParser local_c8;
  
  tlx::CmdlineParser::CmdlineParser(&local_c8);
  local_288 = 0;
  local_290 = 0;
  local_29c = 0;
  local_298 = 0x800000;
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"rw","");
  local_280._M_string_length = 0;
  local_280.field_2._M_local_buf[0] = '\0';
  pcVar2 = local_240 + 0x10;
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  local_240._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"quiet","");
  paVar1 = &local_2c0.field_2;
  local_2c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"quiet processing","");
  tlx::CmdlineParser::add_flag(&local_c8,'q',(string *)local_240,&g_quiet,&local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_240._0_8_ != pcVar2) {
    operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
  }
  local_240._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"size","");
  local_2c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c0,"Amount of data to write/read from disks (e.g. 10GiB)","");
  tlx::CmdlineParser::add_param_bytes(&local_c8,(string *)local_240,&local_288,&local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_240._0_8_ != pcVar2) {
    operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
  }
  local_240._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"r|w","");
  local_2c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c0,"Only read or write blocks (default: both write and read)","");
  tlx::CmdlineParser::add_opt_param_string(&local_c8,(string *)local_240,&local_260,&local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_240._0_8_ != pcVar2) {
    operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
  }
  local_240._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"alloc","");
  local_2c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c0,
             "Block allocation strategy: random_cyclic, simple_random, fully_random, striping. (default: random_cyclic)"
             ,"");
  tlx::CmdlineParser::add_opt_param_string(&local_c8,(string *)local_240,&local_280,&local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_240._0_8_ != pcVar2) {
    operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
  }
  local_240._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"batch","");
  local_2c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c0,"Number of blocks written/read in one batch (default: D * B)","");
  tlx::CmdlineParser::add_unsigned(&local_c8,'b',(string *)local_240,&local_29c,&local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_240._0_8_ != pcVar2) {
    operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
  }
  local_240._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"block_size","");
  local_2c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c0,"Size of blocks written in one syscall. (default: B = 8MiB)","");
  tlx::CmdlineParser::add_bytes(&local_c8,'B',(string *)local_240,&local_298,&local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_240._0_8_ != pcVar2) {
    operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
  }
  local_240._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"offset","");
  local_2c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c0,"Starting offset of operation range. (default: 0)","");
  tlx::CmdlineParser::add_bytes(&local_c8,'o',(string *)local_240,&local_290,&local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_240._0_8_ != pcVar2) {
    operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
  }
  local_240._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"time-limit","");
  local_2c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c0,"limit time of experiment (seconds)","");
  tlx::CmdlineParser::add_double(&local_c8,'T',(string *)local_240,&g_time_limit,&local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_240._0_8_ != pcVar2) {
    operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
  }
  local_240._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_240,
             "This program will benchmark the disks configured by the standard .foxxll disk configuration files mechanism. Blocks of 8 MiB are written and/or read in sequence using the block manager. The batch size describes how many blocks are written/read in one batch. The are taken from block_manager using given the specified allocation strategy. If size == 0, then writing/reading operation are done until an error occurs. "
             ,"");
  tlx::CmdlineParser::set_description(&local_c8,(string *)local_240);
  if ((pointer)local_240._0_8_ != pcVar2) {
    operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
  }
  bVar3 = tlx::CmdlineParser::process(&local_c8,argc,argv);
  iVar5 = -1;
  if (bVar3) {
    if ((local_280._M_string_length == 0) ||
       (iVar4 = std::__cxx11::string::compare((char *)&local_280), iVar4 == 0)) {
      iVar5 = benchmark_disks_alloc<foxxll::random_cyclic>
                        (local_288,local_290,(ulong)local_29c,local_298,&local_260);
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)&local_280);
      if (iVar4 == 0) {
        iVar5 = benchmark_disks_alloc<foxxll::simple_random>
                          (local_288,local_290,(ulong)local_29c,local_298,&local_260);
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&local_280);
        if (iVar4 == 0) {
          iVar5 = benchmark_disks_alloc<foxxll::fully_random>
                            (local_288,local_290,(ulong)local_29c,local_298,&local_260);
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)&local_280);
          if (iVar4 == 0) {
            iVar5 = benchmark_disks_alloc<foxxll::striping>
                              (local_288,local_290,(ulong)local_29c,local_298,&local_260);
          }
          else {
            tlx::Logger::Logger((Logger *)local_240);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_240,"Unknown allocation strategy \'",0x1d);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_240,local_280._M_dataplus._M_p,local_280._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"\'",1);
            tlx::Logger::~Logger((Logger *)local_240);
            tlx::CmdlineParser::print_usage(&local_c8);
          }
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,
                    CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                             local_280.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  tlx::CmdlineParser::~CmdlineParser(&local_c8);
  return iVar5;
}

Assistant:

int benchmark_disks(int argc, char* argv[])
{
    // parse command line

    tlx::CmdlineParser cp;

    external_size_type size = 0, offset = 0;
    unsigned int batch_size = 0;
    external_size_type block_size = 8 * MiB;
    std::string optrw = "rw", allocstr;

    cp.add_flag(
        'q', "quiet", g_quiet, "quiet processing"
    );

    cp.add_param_bytes(
        "size", size,
        "Amount of data to write/read from disks (e.g. 10GiB)"
    );
    cp.add_opt_param_string(
        "r|w", optrw,
        "Only read or write blocks (default: both write and read)"
    );
    cp.add_opt_param_string(
        "alloc", allocstr,
        "Block allocation strategy: random_cyclic, simple_random, fully_random, striping. (default: random_cyclic)"
    );

    cp.add_unsigned(
        'b', "batch", batch_size,
        "Number of blocks written/read in one batch (default: D * B)"
    );
    cp.add_bytes(
        'B', "block_size", block_size,
        "Size of blocks written in one syscall. (default: B = 8MiB)"
    );
    cp.add_bytes(
        'o', "offset", offset,
        "Starting offset of operation range. (default: 0)"
    );
    cp.add_double(
        'T', "time-limit", g_time_limit,
        "limit time of experiment (seconds)"
    );

    cp.set_description(
        "This program will benchmark the disks configured by the standard "
        ".foxxll disk configuration files mechanism. Blocks of 8 MiB are "
        "written and/or read in sequence using the block manager. The batch "
        "size describes how many blocks are written/read in one batch. The "
        "are taken from block_manager using given the specified allocation "
        "strategy. If size == 0, then writing/reading operation are done "
        "until an error occurs. "
    );

    if (!cp.process(argc, argv))
        return -1;

    if (allocstr.size())
    {
        if (allocstr == "random_cyclic")
            return benchmark_disks_alloc<foxxll::random_cyclic>(
                size, offset, batch_size, block_size, optrw
            );
        if (allocstr == "simple_random")
            return benchmark_disks_alloc<foxxll::simple_random>(
                size, offset, batch_size, block_size, optrw
            );
        if (allocstr == "fully_random")
            return benchmark_disks_alloc<foxxll::fully_random>(
                size, offset, batch_size, block_size, optrw
            );
        if (allocstr == "striping")
            return benchmark_disks_alloc<foxxll::striping>(
                size, offset, batch_size, block_size, optrw
            );

        LOG1 << "Unknown allocation strategy '" << allocstr << "'";
        cp.print_usage();
        return -1;
    }

    return benchmark_disks_alloc<foxxll::default_alloc_strategy>(
        size, offset, batch_size, block_size, optrw
    );
}